

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

lua_Number lua_tonumber(lua_State *L,int idx)

{
  StrScanFmt SVar1;
  TValue in_RAX;
  TValue *pTVar2;
  TValue TVar3;
  TValue tmp;
  TValue local_8;
  
  local_8 = in_RAX;
  pTVar2 = index2adr(L,idx);
  if ((pTVar2->field_2).it < 0xffff0000) {
    TVar3.u64 = pTVar2->u64;
  }
  else {
    TVar3.u64 = 0;
    if ((pTVar2->field_2).it == 0xfffffffb) {
      SVar1 = lj_strscan_scan((uint8_t *)((ulong)(pTVar2->u32).lo + 0x10),&local_8,2);
      TVar3.u64 = 0;
      if (SVar1 != STRSCAN_ERROR) {
        TVar3 = local_8;
      }
    }
  }
  return (lua_Number)TVar3.u64;
}

Assistant:

LUA_API lua_Number lua_tonumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (tvisstr(o) && lj_strscan_num(strV(o), &tmp))
    return numV(&tmp);
  else
    return 0;
}